

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

int __thiscall cmCPackDebGenerator::createDeb(cmCPackDebGenerator *this)

{
  _Rb_tree_node_base *p_Var1;
  cmCPackLog *pcVar2;
  undefined4 uVar3;
  uint uVar4;
  size_type skip;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  ostream *poVar27;
  undefined8 uVar28;
  size_type sVar29;
  FILE *__s;
  FILE *__stream;
  size_t sVar30;
  size_t sVar31;
  size_t sVar32;
  Compress c;
  string *inName;
  int iVar33;
  ulong uVar34;
  pointer pbVar35;
  ulong uVar36;
  string outputFileName;
  string strGenWDIR;
  string filename_control_tar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arFiles;
  string md5filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  controlExtraList;
  string dirName;
  uint local_23e0;
  size_t local_23d0;
  __time_t local_23a8;
  string compression_suffix;
  string topLevelString;
  string local_21f8 [64];
  int local_21b8;
  bool local_21b4;
  int local_21b0;
  bool local_21ac;
  uint local_2168;
  bool local_2164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2158;
  string ctlfilename;
  string dbfilename;
  string filename_data_tar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20d8;
  string local_20b8;
  string debian_pkg_name;
  string local_2078;
  string local_2058;
  cmGeneratedFileStream out;
  
  dbfilename._M_dataplus._M_p = (pointer)&dbfilename.field_2;
  dbfilename._M_string_length = 0;
  dbfilename.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&out,"GEN_WDIR",(allocator *)&dirName);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::append((char *)&dbfilename);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::append((char *)&dbfilename);
  cmGeneratedFileStream::cmGeneratedFileStream(&out,dbfilename._M_dataplus._M_p,false);
  std::operator<<((ostream *)&out,"2.0");
  std::endl<char,std::char_traits<char>>((ostream *)&out);
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  ctlfilename._M_dataplus._M_p = (pointer)&ctlfilename.field_2;
  ctlfilename._M_string_length = 0;
  ctlfilename.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&out,"GEN_WDIR",(allocator *)&dirName);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::assign((char *)&ctlfilename);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::append((char *)&ctlfilename);
  std::__cxx11::string::string
            ((string *)&dirName,"GEN_CPACK_DEBIAN_PACKAGE_NAME",(allocator *)&topLevelString);
  pcVar10 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&dirName);
  std::__cxx11::string::string((string *)&out,pcVar10,(allocator *)&md5filename);
  cmsys::SystemTools::LowerCase(&debian_pkg_name,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&dirName);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_VERSION",(allocator *)&dirName);
  pcVar10 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_SECTION",(allocator *)&dirName);
  pcVar11 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PRIORITY",(allocator *)&dirName);
  pcVar12 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE",(allocator *)&dirName);
  pcVar13 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER",(allocator *)&dirName);
  pcVar14 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION",(allocator *)&dirName);
  pcVar15 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_DEPENDS",(allocator *)&dirName);
  pcVar16 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS",(allocator *)&dirName);
  pcVar17 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS",(allocator *)&dirName);
  pcVar18 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE",(allocator *)&dirName);
  pcVar19 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS",(allocator *)&dirName);
  pcVar20 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_ENHANCES",(allocator *)&dirName);
  pcVar21 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_BREAKS",(allocator *)&dirName);
  pcVar22 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS",(allocator *)&dirName);
  pcVar23 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PROVIDES",(allocator *)&dirName);
  pcVar24 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_REPLACES",(allocator *)&dirName);
  pcVar25 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_SOURCE",(allocator *)&dirName);
  pcVar26 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  cmGeneratedFileStream::cmGeneratedFileStream(&out,ctlfilename._M_dataplus._M_p,false);
  poVar27 = std::operator<<((ostream *)&out,"Package: ");
  poVar27 = std::operator<<(poVar27,(string *)&debian_pkg_name);
  std::operator<<(poVar27,"\n");
  poVar27 = std::operator<<((ostream *)&out,"Version: ");
  poVar27 = std::operator<<(poVar27,pcVar10);
  std::operator<<(poVar27,"\n");
  poVar27 = std::operator<<((ostream *)&out,"Section: ");
  poVar27 = std::operator<<(poVar27,pcVar11);
  std::operator<<(poVar27,"\n");
  poVar27 = std::operator<<((ostream *)&out,"Priority: ");
  poVar27 = std::operator<<(poVar27,pcVar12);
  std::operator<<(poVar27,"\n");
  poVar27 = std::operator<<((ostream *)&out,"Architecture: ");
  poVar27 = std::operator<<(poVar27,pcVar13);
  std::operator<<(poVar27,"\n");
  if ((pcVar26 != (char *)0x0) && (*pcVar26 != '\0')) {
    poVar27 = std::operator<<((ostream *)&out,"Source: ");
    poVar27 = std::operator<<(poVar27,pcVar26);
    std::operator<<(poVar27,"\n");
  }
  if ((pcVar16 != (char *)0x0) && (*pcVar16 != '\0')) {
    poVar27 = std::operator<<((ostream *)&out,"Depends: ");
    poVar27 = std::operator<<(poVar27,pcVar16);
    std::operator<<(poVar27,"\n");
  }
  if ((pcVar17 != (char *)0x0) && (*pcVar17 != '\0')) {
    poVar27 = std::operator<<((ostream *)&out,"Recommends: ");
    poVar27 = std::operator<<(poVar27,pcVar17);
    std::operator<<(poVar27,"\n");
  }
  if ((pcVar18 != (char *)0x0) && (*pcVar18 != '\0')) {
    poVar27 = std::operator<<((ostream *)&out,"Suggests: ");
    poVar27 = std::operator<<(poVar27,pcVar18);
    std::operator<<(poVar27,"\n");
  }
  if ((pcVar19 != (char *)0x0) && (*pcVar19 != '\0')) {
    poVar27 = std::operator<<((ostream *)&out,"Homepage: ");
    poVar27 = std::operator<<(poVar27,pcVar19);
    std::operator<<(poVar27,"\n");
  }
  if ((pcVar20 != (char *)0x0) && (*pcVar20 != '\0')) {
    poVar27 = std::operator<<((ostream *)&out,"Pre-Depends: ");
    poVar27 = std::operator<<(poVar27,pcVar20);
    std::operator<<(poVar27,"\n");
  }
  if ((pcVar21 != (char *)0x0) && (*pcVar21 != '\0')) {
    poVar27 = std::operator<<((ostream *)&out,"Enhances: ");
    poVar27 = std::operator<<(poVar27,pcVar21);
    std::operator<<(poVar27,"\n");
  }
  if ((pcVar22 != (char *)0x0) && (*pcVar22 != '\0')) {
    poVar27 = std::operator<<((ostream *)&out,"Breaks: ");
    poVar27 = std::operator<<(poVar27,pcVar22);
    std::operator<<(poVar27,"\n");
  }
  if ((pcVar23 != (char *)0x0) && (*pcVar23 != '\0')) {
    poVar27 = std::operator<<((ostream *)&out,"Conflicts: ");
    poVar27 = std::operator<<(poVar27,pcVar23);
    std::operator<<(poVar27,"\n");
  }
  if ((pcVar24 != (char *)0x0) && (*pcVar24 != '\0')) {
    poVar27 = std::operator<<((ostream *)&out,"Provides: ");
    poVar27 = std::operator<<(poVar27,pcVar24);
    std::operator<<(poVar27,"\n");
  }
  if ((pcVar25 != (char *)0x0) && (*pcVar25 != '\0')) {
    poVar27 = std::operator<<((ostream *)&out,"Replaces: ");
    poVar27 = std::operator<<(poVar27,pcVar25);
    std::operator<<(poVar27,"\n");
  }
  std::__cxx11::string::string
            ((string *)&topLevelString,"CPACK_TEMPORARY_DIRECTORY",(allocator *)&md5filename);
  pcVar10 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&topLevelString);
  std::__cxx11::string::string((string *)&dirName,pcVar10,(allocator *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&topLevelString);
  std::__cxx11::string::push_back('\0');
  for (pbVar35 = (this->packageFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar35 !=
      (this->packageFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar35 = pbVar35 + 1) {
    cmsys::SystemTools::FileLength(pbVar35);
  }
  std::__cxx11::string::~string((string *)&dirName);
  poVar27 = std::operator<<((ostream *)&out,"Installed-Size: ");
  poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)poVar27);
  std::operator<<(poVar27,"\n");
  poVar27 = std::operator<<((ostream *)&out,"Maintainer: ");
  poVar27 = std::operator<<(poVar27,pcVar14);
  std::operator<<(poVar27,"\n");
  poVar27 = std::operator<<((ostream *)&out,"Description: ");
  poVar27 = std::operator<<(poVar27,pcVar15);
  std::operator<<(poVar27,"\n");
  std::endl<char,std::char_traits<char>>((ostream *)&out);
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  std::__cxx11::string::string((string *)&out,"GEN_WDIR",(allocator *)&dirName);
  pcVar10 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::string((string *)&strGenWDIR,pcVar10,(allocator *)&topLevelString);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE",(allocator *)&dirName);
  pcVar11 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  pcVar10 = "gzip";
  if (pcVar11 != (char *)0x0) {
    pcVar10 = pcVar11;
  }
  compression_suffix._M_dataplus._M_p = (pointer)&compression_suffix.field_2;
  compression_suffix._M_string_length = 0;
  compression_suffix.field_2._M_local_buf[0] = '\0';
  iVar9 = strcmp(pcVar10,"lzma");
  if (iVar9 == 0) {
    std::__cxx11::string::assign((char *)&compression_suffix);
    c = CompressLZMA;
  }
  else if (((*pcVar10 == 'x') && (pcVar10[1] == 'z')) && (pcVar10[2] == '\0')) {
    std::__cxx11::string::assign((char *)&compression_suffix);
    c = CompressXZ;
  }
  else {
    iVar9 = strcmp(pcVar10,"bzip2");
    if (iVar9 == 0) {
      std::__cxx11::string::assign((char *)&compression_suffix);
      c = CompressBZip2;
    }
    else {
      iVar9 = strcmp(pcVar10,"gzip");
      c = CompressGZip;
      if (iVar9 == 0) {
        std::__cxx11::string::assign((char *)&compression_suffix);
      }
      else {
        iVar9 = strcmp(pcVar10,"none");
        if (iVar9 == 0) {
          c = CompressNone;
          std::__cxx11::string::assign((char *)&compression_suffix);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
          poVar27 = std::operator<<((ostream *)&out,"Error unrecognized compression type: ");
          poVar27 = std::operator<<(poVar27,pcVar10);
          std::endl<char,std::char_traits<char>>(poVar27);
          pcVar2 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                          ,0x1bb,dirName._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&dirName);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
        }
      }
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &strGenWDIR,"/data.tar");
  std::operator+(&filename_data_tar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &compression_suffix);
  std::__cxx11::string::~string((string *)&out);
  cmGeneratedFileStream::cmGeneratedFileStream(&out);
  cmGeneratedFileStream::Open(&out,filename_data_tar._M_dataplus._M_p,false,true);
  if (((&out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
    poVar27 = std::operator<<((ostream *)&dirName,"Error opening the file \"");
    poVar27 = std::operator<<(poVar27,(string *)&filename_data_tar);
    poVar27 = std::operator<<(poVar27,"\" for writing");
    std::endl<char,std::char_traits<char>>(poVar27);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1ca,topLevelString._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&topLevelString);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
LAB_00295987:
    cmGeneratedFileStream::~cmGeneratedFileStream(&out);
    iVar9 = 0;
    goto LAB_00295996;
  }
  std::__cxx11::string::string((string *)&dirName,"paxr",(allocator *)&md5filename);
  cmArchiveWrite::cmArchiveWrite((cmArchiveWrite *)&topLevelString,(ostream *)&out,c,&dirName);
  std::__cxx11::string::~string((string *)&dirName);
  local_21b4 = true;
  local_21b8 = 0;
  local_21ac = true;
  local_21b0 = 0;
  std::__cxx11::string::string((string *)&dirName,"root",(allocator *)&filename_control_tar);
  std::__cxx11::string::string((string *)&md5filename,"root",(allocator *)&outputFileName);
  cmArchiveWrite::SetUNAMEAndGNAME((cmArchiveWrite *)&topLevelString,&dirName,&md5filename);
  std::__cxx11::string::~string((string *)&md5filename);
  std::__cxx11::string::~string((string *)&dirName);
  skip = strGenWDIR._M_string_length;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
  poVar27 = std::operator<<((ostream *)&dirName,"WDIR: \"");
  poVar27 = std::operator<<(poVar27,(string *)&strGenWDIR);
  poVar27 = std::operator<<(poVar27,"\", length = ");
  poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)poVar27);
  std::endl<char,std::char_traits<char>>(poVar27);
  pcVar2 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                  ,0x1dc,md5filename._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&md5filename);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
  md5filename.field_2._8_8_ = &md5filename._M_string_length;
  md5filename._M_string_length._0_4_ = 0;
  md5filename.field_2._M_allocated_capacity = 0;
  for (pbVar35 = (this->packageFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar35 !=
      (this->packageFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar35 = pbVar35 + 1) {
    std::__cxx11::string::string((string *)&dirName,(string *)pbVar35);
    while (bVar6 = std::operator!=(&dirName,&strGenWDIR), bVar6) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&md5filename,&dirName);
      std::__cxx11::string::string((string *)&outputFileName,"..",(allocator *)&arFiles);
      cmSystemTools::CollapseCombinedPath(&filename_control_tar,&dirName,&outputFileName);
      std::__cxx11::string::operator=((string *)&dirName,(string *)&filename_control_tar);
      std::__cxx11::string::~string((string *)&filename_control_tar);
      std::__cxx11::string::~string((string *)&outputFileName);
    }
    std::__cxx11::string::~string((string *)&dirName);
  }
  for (uVar28 = md5filename.field_2._8_8_; (size_type *)uVar28 != &md5filename._M_string_length;
      uVar28 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar28)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
    poVar27 = std::operator<<((ostream *)&dirName,"FILEIT: \"");
    p_Var1 = (_Rb_tree_node_base *)(uVar28 + 0x20);
    poVar27 = std::operator<<(poVar27,(string *)p_Var1);
    poVar27 = std::operator<<(poVar27,"\"");
    std::endl<char,std::char_traits<char>>(poVar27);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1f6,filename_control_tar._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&filename_control_tar);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
    std::__cxx11::string::find((char)p_Var1,0x2f);
    std::__cxx11::string::substr((ulong)&filename_control_tar,(ulong)p_Var1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
    poVar27 = std::operator<<((ostream *)&dirName,"RELATIVEDIR: \"");
    poVar27 = std::operator<<(poVar27,(string *)&filename_control_tar);
    poVar27 = std::operator<<(poVar27,"\"");
    std::endl<char,std::char_traits<char>>(poVar27);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1fb,outputFileName._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&outputFileName);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
    std::__cxx11::string::string((string *)&local_2058,(string *)p_Var1);
    bVar6 = cmArchiveWrite::Add((cmArchiveWrite *)&topLevelString,&local_2058,skip,".",false);
    std::__cxx11::string::~string((string *)&local_2058);
    if (!bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
      poVar27 = std::operator<<((ostream *)&dirName,"Problem adding file to tar:");
      poVar27 = std::endl<char,std::char_traits<char>>(poVar27);
      poVar27 = std::operator<<(poVar27,"#top level directory: ");
      poVar27 = std::operator<<(poVar27,(string *)&strGenWDIR);
      poVar27 = std::endl<char,std::char_traits<char>>(poVar27);
      poVar27 = std::operator<<(poVar27,"#file: ");
      poVar27 = std::operator<<(poVar27,(string *)p_Var1);
      poVar27 = std::endl<char,std::char_traits<char>>(poVar27);
      poVar27 = std::operator<<(poVar27,"#error:");
      std::__cxx11::string::string((string *)&outputFileName,local_21f8);
      poVar27 = std::operator<<(poVar27,(string *)&outputFileName);
      std::endl<char,std::char_traits<char>>(poVar27);
      std::__cxx11::string::~string((string *)&outputFileName);
      pcVar2 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x205,outputFileName._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&outputFileName);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
      std::__cxx11::string::~string((string *)&filename_control_tar);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&md5filename);
      cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)&topLevelString);
      goto LAB_00295987;
    }
    std::__cxx11::string::~string((string *)&filename_control_tar);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&md5filename);
  cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)&topLevelString);
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  std::operator+(&md5filename,&strGenWDIR,"/md5sums");
  cmGeneratedFileStream::cmGeneratedFileStream(&out,md5filename._M_dataplus._M_p,false);
  std::__cxx11::string::string
            ((string *)&dirName,"CPACK_TEMPORARY_DIRECTORY",(allocator *)&topLevelString);
  pcVar10 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&dirName);
  std::__cxx11::string::string((string *)&filename_control_tar,pcVar10,(allocator *)&outputFileName)
  ;
  std::__cxx11::string::~string((string *)&dirName);
  std::__cxx11::string::push_back((char)&filename_control_tar);
  for (inName = (this->packageFiles).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      inName != (this->packageFiles).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; inName = inName + 1) {
    bVar6 = cmsys::SystemTools::FileIsDirectory(inName);
    if ((!bVar6) && (bVar6 = cmsys::SystemTools::FileIsSymlink(inName), !bVar6)) {
      bVar6 = cmSystemTools::ComputeFileMD5(inName,(char *)&topLevelString);
      if (!bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
        poVar27 = std::operator<<((ostream *)&dirName,"Problem computing the md5 of ");
        poVar27 = std::operator<<(poVar27,(string *)inName);
        std::endl<char,std::char_traits<char>>(poVar27);
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                        ,0x223,outputFileName._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&outputFileName);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
      }
      std::__cxx11::string::string
                ((string *)&dirName,(char *)&topLevelString,(allocator *)&outputFileName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arFiles,
                     "  ",inName);
      std::operator+(&outputFileName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arFiles,
                     "\n");
      std::__cxx11::string::append((string *)&dirName);
      std::__cxx11::string::~string((string *)&outputFileName);
      std::__cxx11::string::~string((string *)&arFiles);
      cmsys::SystemTools::ReplaceString(&dirName,filename_control_tar._M_dataplus._M_p,"");
      std::operator<<((ostream *)&out,(string *)&dirName);
      std::__cxx11::string::~string((string *)&dirName);
    }
  }
  std::__cxx11::string::~string((string *)&filename_control_tar);
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  std::operator+(&filename_control_tar,&strGenWDIR,"/control.tar.gz");
  cmGeneratedFileStream::cmGeneratedFileStream(&out);
  cmGeneratedFileStream::Open(&out,filename_control_tar._M_dataplus._M_p,false,true);
  if (((&out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    std::__cxx11::string::string((string *)&dirName,"paxr",(allocator *)&outputFileName);
    cmArchiveWrite::cmArchiveWrite
              ((cmArchiveWrite *)&topLevelString,(ostream *)&out,CompressGZip,&dirName);
    std::__cxx11::string::~string((string *)&dirName);
    local_21b4 = true;
    local_21b8 = 0;
    local_21ac = true;
    local_21b0 = 0;
    std::__cxx11::string::string((string *)&dirName,"root",(allocator *)&arFiles);
    std::__cxx11::string::string((string *)&outputFileName,"root",(allocator *)&local_2158);
    cmArchiveWrite::SetUNAMEAndGNAME((cmArchiveWrite *)&topLevelString,&dirName,&outputFileName);
    std::__cxx11::string::~string((string *)&outputFileName);
    std::__cxx11::string::~string((string *)&dirName);
    local_2164 = true;
    local_2168 = 0x1a4;
    std::__cxx11::string::string((string *)&local_20b8,(string *)&md5filename);
    bVar7 = cmArchiveWrite::Add((cmArchiveWrite *)&topLevelString,&local_20b8,
                                strGenWDIR._M_string_length,".",true);
    bVar6 = true;
    if (bVar7) {
      std::operator+(&local_20d8,&strGenWDIR,"/control");
      bVar6 = cmArchiveWrite::Add((cmArchiveWrite *)&topLevelString,&local_20d8,
                                  strGenWDIR._M_string_length,".",true);
      bVar6 = !bVar6;
      std::__cxx11::string::~string((string *)&local_20d8);
    }
    std::__cxx11::string::~string((string *)&local_20b8);
    if (bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
      poVar27 = std::operator<<((ostream *)&dirName,"Error adding file to tar:");
      poVar27 = std::endl<char,std::char_traits<char>>(poVar27);
      poVar27 = std::operator<<(poVar27,"#top level directory: ");
      poVar27 = std::operator<<(poVar27,(string *)&strGenWDIR);
      poVar27 = std::endl<char,std::char_traits<char>>(poVar27);
      poVar27 = std::operator<<(poVar27,"#file: \"control\" or \"md5sums\"");
      poVar27 = std::endl<char,std::char_traits<char>>(poVar27);
      poVar27 = std::operator<<(poVar27,"#error:");
      std::__cxx11::string::string((string *)&outputFileName,local_21f8);
      poVar27 = std::operator<<(poVar27,(string *)&outputFileName);
      std::endl<char,std::char_traits<char>>(poVar27);
      std::__cxx11::string::~string((string *)&outputFileName);
      pcVar2 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x262,outputFileName._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&outputFileName);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
    }
    else {
      std::__cxx11::string::string
                ((string *)&dirName,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA",
                 (allocator *)&outputFileName);
      pcVar10 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&dirName);
      std::__cxx11::string::~string((string *)&dirName);
      if (pcVar10 != (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&dirName,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION",
                   (allocator *)&outputFileName);
        bVar7 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&dirName);
        std::__cxx11::string::~string((string *)&dirName);
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::set<char_const**>((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&dirName,createDeb::strictFiles,(char **)&copy_ar(CF*,long)::pad);
        local_2164 = false;
        controlExtraList.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        controlExtraList.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        controlExtraList.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&outputFileName,pcVar10,(allocator *)&arFiles);
        cmSystemTools::ExpandListArgument(&outputFileName,&controlExtraList,false);
        std::__cxx11::string::~string((string *)&outputFileName);
        for (pbVar35 = controlExtraList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar35 !=
            controlExtraList.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar35 = pbVar35 + 1) {
          cmsys::SystemTools::GetFilenameName(&outputFileName,pbVar35);
          std::operator+(&local_2158,&strGenWDIR,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &arFiles,&local_2158,&outputFileName);
          std::__cxx11::string::~string((string *)&local_2158);
          if (bVar7) {
            sVar29 = std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&dirName,&outputFileName);
            local_2168 = 0x1ed;
            if (sVar29 == 0) {
              local_2168 = 0x1a4;
            }
            local_2164 = true;
          }
          bVar8 = cmsys::SystemTools::CopyFileIfDifferent
                            (pbVar35,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&arFiles);
          if (bVar8) {
            std::__cxx11::string::string((string *)&local_2078,(string *)&arFiles);
            cmArchiveWrite::Add((cmArchiveWrite *)&topLevelString,&local_2078,
                                strGenWDIR._M_string_length,".",true);
            std::__cxx11::string::~string((string *)&local_2078);
          }
          std::__cxx11::string::~string((string *)&arFiles);
          std::__cxx11::string::~string((string *)&outputFileName);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&controlExtraList);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&dirName);
      }
    }
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)&topLevelString);
    cmGeneratedFileStream::~cmGeneratedFileStream(&out);
    iVar9 = 0;
    if (!bVar6) {
      arFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      arFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      arFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::operator+(&topLevelString,&strGenWDIR,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     &topLevelString,"debian-binary");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
      std::__cxx11::string::~string((string *)&out);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     &topLevelString,"control.tar.gz");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
      std::__cxx11::string::~string((string *)&out);
      std::operator+(&dirName,&topLevelString,"data.tar");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     &dirName,&compression_suffix);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::~string((string *)&dirName);
      std::__cxx11::string::string((string *)&out,"CPACK_TOPLEVEL_DIRECTORY",(allocator *)&dirName);
      pcVar10 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
      std::__cxx11::string::string((string *)&outputFileName,pcVar10,(allocator *)&local_2158);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::append((char *)&outputFileName);
      std::__cxx11::string::string((string *)&out,"CPACK_OUTPUT_FILE_NAME",(allocator *)&dirName);
      cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
      std::__cxx11::string::append((char *)&outputFileName);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::string
                ((string *)&out,outputFileName._M_dataplus._M_p,(allocator *)&dirName);
      __s = (FILE *)cmsys::SystemTools::Fopen((string *)&out,"wb+");
      std::__cxx11::string::~string((string *)&out);
      if (__s == (FILE *)0x0) {
        iVar33 = -4;
LAB_0029639f:
        std::__cxx11::string::string
                  ((string *)&out,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",(allocator *)&local_2158);
        pcVar10 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
        std::__cxx11::string::string((string *)&dirName,pcVar10,(allocator *)&controlExtraList);
        std::__cxx11::string::~string((string *)&out);
        std::__cxx11::string::append((char *)&dirName);
        cmGeneratedFileStream::cmGeneratedFileStream(&out,dirName._M_dataplus._M_p,false);
        poVar27 = std::operator<<((ostream *)&out,"# Problem creating archive using: ");
        poVar27 = (ostream *)std::ostream::operator<<(poVar27,iVar33);
        std::endl<char,std::char_traits<char>>(poVar27);
        cmGeneratedFileStream::~cmGeneratedFileStream(&out);
        std::__cxx11::string::~string((string *)&dirName);
        iVar9 = 0;
      }
      else {
        fwrite("!<arch>\n",8,1,__s);
        iVar9 = fseek(__s,0,2);
        if (iVar9 == -1) {
          iVar33 = -3;
        }
        else {
          iVar33 = 0;
          for (pbVar35 = arFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pbVar35 !=
              arFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; pbVar35 = pbVar35 + 1) {
            pcVar10 = (pbVar35->_M_dataplus)._M_p;
            std::__cxx11::string::string((string *)&out,pcVar10,(allocator *)&local_2158);
            __stream = (FILE *)cmsys::SystemTools::Fopen((string *)&out,"rb");
            std::__cxx11::string::~string((string *)&out);
            iVar9 = -1;
            if (__stream != (FILE *)0x0) {
              pcVar12 = strrchr(pcVar10,0x2f);
              pcVar11 = pcVar12 + 1;
              if (pcVar12 == (char *)0x0) {
                pcVar11 = pcVar10;
              }
              stat64(pcVar10,(stat64 *)&dirName);
              sVar30 = strlen(pcVar11);
              uVar3 = dirName.field_2._12_4_;
              if (0xfffe < (uint)dirName.field_2._12_4_) {
                uVar3 = 0xffff;
              }
              uVar4 = local_23e0;
              if (0xfffe < local_23e0) {
                uVar4 = 0xffff;
              }
              if ((sVar30 < 0x11) && (pcVar10 = strchr(pcVar11,0x20), pcVar10 == (char *)0x0)) {
                sprintf(ar_hb,"%-16.16s%-12ld%-6u%-6u%-8o%-10lld%2s",pcVar11,local_23a8,
                        (ulong)(uint)uVar3,(ulong)uVar4,(ulong)(uint)dirName.field_2._8_4_,
                        local_23d0,"`\n");
                sVar30 = 0;
              }
              else {
                sprintf(ar_hb,"%s%-13d%-12ld%-6u%-6u%-8o%-10lld%2s","#1/",sVar30 & 0xffffffff,
                        local_23a8,(ulong)(uint)uVar3,(ulong)uVar4,
                        (ulong)(uint)dirName.field_2._8_4_,sVar30 + local_23d0,"`\n");
              }
              sVar31 = fwrite(ar_hb,1,0x3c,__s);
              if ((sVar31 != 0x3c) ||
                 ((sVar5 = ar_already_written, sVar30 != 0 &&
                  (sVar31 = fwrite(pcVar11,1,sVar30,__s), sVar5 = sVar30, sVar31 != sVar30)))) {
LAB_0029637b:
                fclose(__stream);
                iVar33 = -2;
                break;
              }
              ar_already_written = sVar5;
              sVar30 = local_23d0;
              if (local_23d0 != 0) {
                while (sVar30 != 0) {
                  sVar31 = 0x2000;
                  if ((long)sVar30 < 0x2000) {
                    sVar31 = sVar30;
                  }
                  sVar31 = fread(&out,1,sVar31,__stream);
                  if (sVar31 == 0) goto LAB_00296373;
                  sVar30 = sVar30 - sVar31;
                  for (uVar36 = 0; uVar34 = sVar31 - uVar36, uVar36 <= sVar31 && uVar34 != 0;
                      uVar36 = uVar36 + sVar32) {
                    sVar32 = fwrite((void *)((long)&out.super_ofstream.
                                                                                                        
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar36),1,sVar31,__s);
                    if (sVar32 < sVar31) goto LAB_00296373;
                    sVar31 = uVar34;
                  }
                }
                if ((((int)local_23d0 + (int)ar_already_written & 1U) != 0) &&
                   (sVar30 = fwrite(&copy_ar(CF*,long)::pad,1,1,__s), sVar30 != 1)) {
LAB_00296373:
                  ar_already_written = 0;
                  goto LAB_0029637b;
                }
              }
              ar_already_written = 0;
              fclose(__stream);
              iVar9 = iVar33;
            }
            iVar33 = iVar9;
          }
        }
        fclose(__s);
        iVar9 = 1;
        if (iVar33 != 0) goto LAB_0029639f;
      }
      std::__cxx11::string::~string((string *)&outputFileName);
      std::__cxx11::string::~string((string *)&topLevelString);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&arFiles);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
    poVar27 = std::operator<<((ostream *)&dirName,"Error opening the file \"");
    poVar27 = std::operator<<(poVar27,(string *)&filename_control_tar);
    poVar27 = std::operator<<(poVar27,"\" for writing");
    std::endl<char,std::char_traits<char>>(poVar27);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x240,topLevelString._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&topLevelString);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
    cmGeneratedFileStream::~cmGeneratedFileStream(&out);
    iVar9 = 0;
  }
  std::__cxx11::string::~string((string *)&filename_control_tar);
  std::__cxx11::string::~string((string *)&md5filename);
LAB_00295996:
  std::__cxx11::string::~string((string *)&filename_data_tar);
  std::__cxx11::string::~string((string *)&compression_suffix);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&debian_pkg_name);
  std::__cxx11::string::~string((string *)&ctlfilename);
  std::__cxx11::string::~string((string *)&dbfilename);
  return iVar9;
}

Assistant:

int cmCPackDebGenerator::createDeb()
{
  // debian-binary file
  std::string dbfilename;
    dbfilename += this->GetOption("GEN_WDIR");
  dbfilename += "/debian-binary";
    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(dbfilename.c_str());
    out << "2.0";
    out << std::endl; // required for valid debian package
    }

  // control file
  std::string ctlfilename;
    ctlfilename = this->GetOption("GEN_WDIR");
  ctlfilename += "/control";

  // debian policy enforce lower case for package name
  // mandatory entries:
  std::string debian_pkg_name = cmsys::SystemTools::LowerCase(
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME") );
  const char* debian_pkg_version =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");
  const char* debian_pkg_section =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SECTION");
  const char* debian_pkg_priority =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PRIORITY");
  const char* debian_pkg_arch =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  const char* maintainer =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  const char* desc =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION");

  // optional entries
  const char* debian_pkg_dep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DEPENDS");
  const char* debian_pkg_rec =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS");
  const char* debian_pkg_sug =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS");
  const char* debian_pkg_url =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE");
  const char* debian_pkg_predep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS");
  const char* debian_pkg_enhances =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ENHANCES");
  const char* debian_pkg_breaks =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_BREAKS");
  const char* debian_pkg_conflicts =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS");
  const char* debian_pkg_provides =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PROVIDES");
  const char* debian_pkg_replaces =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_REPLACES");
  const char* debian_pkg_source =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SOURCE");


    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(ctlfilename.c_str());
    out << "Package: " << debian_pkg_name << "\n";
    out << "Version: " << debian_pkg_version << "\n";
    out << "Section: " << debian_pkg_section << "\n";
    out << "Priority: " << debian_pkg_priority << "\n";
    out << "Architecture: " << debian_pkg_arch << "\n";
    if(debian_pkg_source && *debian_pkg_source)
      {
      out << "Source: " << debian_pkg_source << "\n";
      }
    if(debian_pkg_dep && *debian_pkg_dep)
      {
      out << "Depends: " << debian_pkg_dep << "\n";
      }
    if(debian_pkg_rec && *debian_pkg_rec)
      {
      out << "Recommends: " << debian_pkg_rec << "\n";
      }
    if(debian_pkg_sug && *debian_pkg_sug)
      {
      out << "Suggests: " << debian_pkg_sug << "\n";
      }
    if(debian_pkg_url && *debian_pkg_url)
      {
      out << "Homepage: " << debian_pkg_url << "\n";
      }
    if (debian_pkg_predep && *debian_pkg_predep)
      {
      out << "Pre-Depends: " << debian_pkg_predep << "\n";
      }
    if (debian_pkg_enhances && *debian_pkg_enhances)
      {
      out << "Enhances: " << debian_pkg_enhances << "\n";
      }
    if (debian_pkg_breaks && *debian_pkg_breaks)
      {
      out << "Breaks: " << debian_pkg_breaks << "\n";
      }
    if (debian_pkg_conflicts && *debian_pkg_conflicts)
      {
      out << "Conflicts: " << debian_pkg_conflicts << "\n";
      }
    if (debian_pkg_provides && *debian_pkg_provides)
      {
      out << "Provides: " << debian_pkg_provides << "\n";
      }
    if (debian_pkg_replaces && *debian_pkg_replaces)
      {
      out << "Replaces: " << debian_pkg_replaces << "\n";
      }
    unsigned long totalSize = 0;
    {
      std::string dirName = this->GetOption("CPACK_TEMPORARY_DIRECTORY");
      dirName += '/';
      for (std::vector<std::string>::const_iterator fileIt =
           packageFiles.begin();
           fileIt != packageFiles.end(); ++ fileIt )
        {
        totalSize += cmSystemTools::FileLength(*fileIt);
        }
    }
    out << "Installed-Size: " << (totalSize + 1023) / 1024 << "\n";
    out << "Maintainer: " << maintainer << "\n";
    out << "Description: " << desc << "\n";
    out << std::endl;
    }

  const std::string strGenWDIR(this->GetOption("GEN_WDIR"));

  cmArchiveWrite::Compress tar_compression_type = cmArchiveWrite::CompressGZip;
  const char* debian_compression_type =
      this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE");
  if(!debian_compression_type)
    {
    debian_compression_type = "gzip";
    }

  std::string compression_suffix;
  if(!strcmp(debian_compression_type, "lzma")) {
      compression_suffix = ".lzma";
      tar_compression_type = cmArchiveWrite::CompressLZMA;
  } else if(!strcmp(debian_compression_type, "xz")) {
      compression_suffix = ".xz";
      tar_compression_type = cmArchiveWrite::CompressXZ;
  } else if(!strcmp(debian_compression_type, "bzip2")) {
      compression_suffix = ".bz2";
      tar_compression_type = cmArchiveWrite::CompressBZip2;
  } else if(!strcmp(debian_compression_type, "gzip")) {
      compression_suffix = ".gz";
      tar_compression_type = cmArchiveWrite::CompressGZip;
  } else if(!strcmp(debian_compression_type, "none")) {
      compression_suffix = "";
      tar_compression_type = cmArchiveWrite::CompressNone;
  } else {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Error unrecognized compression type: "
                    << debian_compression_type << std::endl);
  }


  std::string filename_data_tar = strGenWDIR
      + "/data.tar" + compression_suffix;

  // atomic file generation for data.tar
  {
    cmGeneratedFileStream fileStream_data_tar;
    fileStream_data_tar.Open(filename_data_tar.c_str(), false, true);
    if(!fileStream_data_tar)
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Error opening the file \"" << filename_data_tar << "\" for writing"
          << std::endl);
      return 0;
      }
    cmArchiveWrite data_tar(fileStream_data_tar, tar_compression_type, "paxr");

    // uid/gid should be the one of the root user, and this root user has
    // always uid/gid equal to 0.
    data_tar.SetUIDAndGID(0u, 0u);
    data_tar.SetUNAMEAndGNAME("root", "root");

    // now add all directories which have to be compressed
    // collect all top level install dirs for that
    // e.g. /opt/bin/foo, /usr/bin/bar and /usr/bin/baz would
    // give /usr and /opt
    size_t topLevelLength = strGenWDIR.length();
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "WDIR: \""
            << strGenWDIR
            << "\", length = " << topLevelLength
            << std::endl);
    std::set<std::string> orderedFiles;

    // we have to reconstruct the parent folders as well

    for (std::vector<std::string>::const_iterator fileIt =
         packageFiles.begin();
         fileIt != packageFiles.end(); ++ fileIt )
      {
      std::string currentPath = *fileIt;
      while(currentPath != strGenWDIR)
        {
        // the last one IS strGenWDIR, but we do not want this one:
        // XXX/application/usr/bin/myprogram with GEN_WDIR=XXX/application
        // should not add XXX/application
        orderedFiles.insert(currentPath);
        currentPath = cmSystemTools::CollapseCombinedPath(currentPath, "..");
        }
      }


    for (std::set<std::string>::const_iterator fileIt =
         orderedFiles.begin();
         fileIt != orderedFiles.end(); ++ fileIt )
      {
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "FILEIT: \"" << *fileIt << "\""
                    << std::endl);
      std::string::size_type slashPos = fileIt->find('/', topLevelLength+1);
      std::string relativeDir = fileIt->substr(topLevelLength,
                                               slashPos - topLevelLength);
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "RELATIVEDIR: \"" << relativeDir
                    << "\"" << std::endl);

      // do not recurse because the loop will do it
      if(!data_tar.Add(*fileIt, topLevelLength, ".", false))
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Problem adding file to tar:" << std::endl
                      << "#top level directory: "
                      << strGenWDIR << std::endl
                      << "#file: " << *fileIt << std::endl
                      << "#error:" << data_tar.GetError() << std::endl);
        return 0;
        }
      }
  } // scope for file generation


  std::string md5filename = strGenWDIR + "/md5sums";
  {
    // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(md5filename.c_str());

    std::string topLevelWithTrailingSlash =
        this->GetOption("CPACK_TEMPORARY_DIRECTORY");
    topLevelWithTrailingSlash += '/';
    for (std::vector<std::string>::const_iterator fileIt =
           packageFiles.begin();
         fileIt != packageFiles.end(); ++ fileIt )
      {
      // hash only regular files
      if(   cmSystemTools::FileIsDirectory(*fileIt)
         || cmSystemTools::FileIsSymlink(*fileIt))
        {
        continue;
        }

      char md5sum[33];
      if(!cmSystemTools::ComputeFileMD5(*fileIt, md5sum))
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem computing the md5 of "
                      << *fileIt << std::endl);
        }

      md5sum[32] = 0;

      std::string output(md5sum);
      output += "  " + *fileIt + "\n";
      // debian md5sums entries are like this:
      // 014f3604694729f3bf19263bac599765  usr/bin/ccmake
      // thus strip the full path (with the trailing slash)
      cmSystemTools::ReplaceString(output,
                                   topLevelWithTrailingSlash.c_str(), "");
      out << output;
      }
    // each line contains a eol.
    // Do not end the md5sum file with yet another (invalid)
  }



  std::string filename_control_tar = strGenWDIR + "/control.tar.gz";
  // atomic file generation for control.tar
  {
    cmGeneratedFileStream fileStream_control_tar;
    fileStream_control_tar.Open(filename_control_tar.c_str(), false, true);
    if(!fileStream_control_tar)
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Error opening the file \"" << filename_control_tar
          << "\" for writing" << std::endl);
      return 0;
      }
    cmArchiveWrite control_tar(fileStream_control_tar,
                               cmArchiveWrite::CompressGZip,
                               "paxr");

    // sets permissions and uid/gid for the files
    control_tar.SetUIDAndGID(0u, 0u);
    control_tar.SetUNAMEAndGNAME("root", "root");

    /* permissions are set according to
    https://www.debian.org/doc/debian-policy/ch-files.html#s-permissions-owners
    and
    https://lintian.debian.org/tags/control-file-has-bad-permissions.html
    */
    const mode_t permission644 = S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    const mode_t permissionExecute = S_IXUSR | S_IXGRP | S_IXOTH;
    const mode_t permission755 = permission644 | permissionExecute;

    // for md5sum and control (that we have generated here), we use 644
    // (RW-R--R--)
    // so that deb lintian doesn't warn about it
    control_tar.SetPermissions(permission644);

    // adds control and md5sums
    if(   !control_tar.Add(md5filename, strGenWDIR.length(), ".")
       || !control_tar.Add(strGenWDIR + "/control", strGenWDIR.length(), "."))
      {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
            "Error adding file to tar:" << std::endl
            << "#top level directory: "
               << strGenWDIR << std::endl
            << "#file: \"control\" or \"md5sums\"" << std::endl
            << "#error:" << control_tar.GetError() << std::endl);
        return 0;
      }

    // for the other files, we use
    // -either the original permission on the files
    // -either a permission strictly defined by the Debian policies
    const char* controlExtra =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA");
    if( controlExtra )
      {
      // permissions are now controlled by the original file permissions

      const bool permissionStrictPolicy =
        this->IsSet("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION");

      static const char* strictFiles[] = {
        "config", "postinst", "postrm", "preinst", "prerm"
        };
      std::set<std::string> setStrictFiles(
        strictFiles,
        strictFiles + sizeof(strictFiles)/sizeof(strictFiles[0]));

      // default
      control_tar.ClearPermissions();

      std::vector<std::string> controlExtraList;
      cmSystemTools::ExpandListArgument(controlExtra, controlExtraList);
      for(std::vector<std::string>::iterator i = controlExtraList.begin();
          i != controlExtraList.end(); ++i)
        {
        std::string filenamename =
          cmsys::SystemTools::GetFilenameName(*i);
        std::string localcopy = strGenWDIR + "/" + filenamename;

        if(permissionStrictPolicy)
          {
          control_tar.SetPermissions(setStrictFiles.count(filenamename) ?
            permission755 : permission644);
          }

        // if we can copy the file, it means it does exist, let's add it:
        if( cmsys::SystemTools::CopyFileIfDifferent(*i, localcopy) )
          {
          control_tar.Add(localcopy, strGenWDIR.length(), ".");
          }
        }
      }
  }


  // ar -r your-package-name.deb debian-binary control.tar.* data.tar.*
  // since debian packages require BSD ar (most Linux distros and even
  // FreeBSD and NetBSD ship GNU ar) we use a copy of OpenBSD ar here.
  std::vector<std::string> arFiles;
  std::string topLevelString = strGenWDIR + "/";
  arFiles.push_back(topLevelString + "debian-binary");
  arFiles.push_back(topLevelString + "control.tar.gz");
  arFiles.push_back(topLevelString + "data.tar" + compression_suffix);
  std::string outputFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  outputFileName += "/";
  outputFileName += this->GetOption("CPACK_OUTPUT_FILE_NAME");
  int res = ar_append(outputFileName.c_str(), arFiles);
  if ( res!=0 )
    {
    std::string tmpFile = this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Problem creating archive using: " << res << std::endl;
    return 0;
    }
  return 1;
}